

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O3

bool __thiscall
cmComputeTargetDepends::ComputeFinalDepends
          (cmComputeTargetDepends *this,cmComputeComponentGraph *ccg)

{
  Graph *pGVar1;
  pointer pcVar2;
  pointer puVar3;
  pointer pcVar4;
  pointer pcVar5;
  undefined8 uVar6;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar7;
  bool bVar8;
  undefined8 extraout_RAX;
  undefined8 uVar9;
  long lVar10;
  pointer puVar11;
  size_t c;
  cmGraphEdge *ni;
  pointer pcVar12;
  size_t head;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> visited;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> emitted;
  size_t local_d8;
  undefined8 local_d0;
  ulong local_c8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_c0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_b8;
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  local_b0;
  ulong local_80;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_78;
  cmComputeComponentGraph *local_70;
  Graph *local_68;
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  local_60;
  
  pGVar1 = &this->FinalGraph;
  std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::resize
            (&pGVar1->super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>,0);
  local_68 = pGVar1;
  std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::resize
            (&pGVar1->super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>,
             ((long)(this->InitialGraph).
                    super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                    super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->InitialGraph).
                    super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                    super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  local_b8 = &this->ComponentHead;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (local_b8,((long)(ccg->Components).
                             super__Vector_base<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)(ccg->Components).
                             super__Vector_base<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  local_78 = &this->ComponentTail;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (local_78,((long)(ccg->Components).
                             super__Vector_base<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)(ccg->Components).
                             super__Vector_base<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  pcVar2 = (ccg->Components).super__Vector_base<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>.
           _M_impl.super__Vector_impl_data._M_start;
  lVar10 = (long)(ccg->Components).
                 super__Vector_base<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)pcVar2;
  if (lVar10 == 0) {
    uVar9 = CONCAT71((int7)((ulong)pcVar2 >> 8),1);
  }
  else {
    local_c0 = &ccg->TarjanComponents;
    local_c8 = (lVar10 >> 3) * -0x5555555555555555;
    local_80 = local_c8 + (local_c8 == 0);
    uVar9 = 0;
    c = 0;
    do {
      local_d8 = 0xffffffffffffffff;
      local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_60._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_60._M_impl.super__Rb_tree_header._M_header;
      local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
      pcVar2 = (ccg->Components).
               super__Vector_base<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar3 = *(pointer *)
                &pcVar2[c].super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl;
      local_60._M_impl.super__Rb_tree_header._M_header._M_right =
           local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      uVar6 = local_d0;
      for (puVar11 = *(pointer *)
                      ((long)&pcVar2[c].super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl + 8); local_d0 = uVar9, puVar11 != puVar3;
          puVar11 = puVar11 + -1) {
        local_b0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_b0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_b0._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_b0._M_impl.super__Rb_tree_header._M_header;
        local_b0._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_b0._M_impl.super__Rb_tree_header._M_header._M_right =
             local_b0._M_impl.super__Rb_tree_header._M_header._M_left;
        bVar8 = IntraComponent(this,local_c0,c,puVar11[-1],&local_d8,
                               (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                                *)&local_60,
                               (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                                *)&local_b0);
        if (!bVar8) {
          ComplainAboutBadComponent(this,ccg,c,true);
          std::
          _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
          ::~_Rb_tree(&local_b0);
          std::
          _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
          ::~_Rb_tree(&local_60);
          goto LAB_004e7be8;
        }
        std::
        _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
        ::~_Rb_tree(&local_b0);
        uVar9 = local_d0;
        uVar6 = local_d0;
      }
      (local_b8->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_start[c] = local_d8;
      local_d0 = uVar6;
      std::
      _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
      ::~_Rb_tree(&local_60);
      c = c + 1;
      uVar9 = CONCAT71((int7)((ulong)extraout_RAX >> 8),local_c8 <= c);
    } while (c != local_80);
  }
  pGVar1 = local_68;
  pvVar7 = local_b8;
  lVar10 = (long)(ccg->ComponentGraph).
                 super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                 super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(ccg->ComponentGraph).
                 super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                 super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                 super__Vector_impl_data._M_start;
  local_d0 = uVar9;
  if (lVar10 != 0) {
    lVar10 = (lVar10 >> 3) * -0x5555555555555555;
    local_c8 = lVar10 + (ulong)(lVar10 == 0);
    lVar10 = 0;
    local_70 = ccg;
    do {
      pcVar4 = (local_70->ComponentGraph).
               super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
               super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
               super__Vector_impl_data._M_start;
      pcVar12 = *(pointer *)
                 &pcVar4[lVar10].super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>.
                  super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_>;
      pcVar5 = *(pointer *)
                ((long)&pcVar4[lVar10].super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>.
                        super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_> + 8);
      if (pcVar12 != pcVar5) {
        local_c0 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   (local_78->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_start[lVar10];
        do {
          local_60._M_impl._0_8_ =
               (pvVar7->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start[pcVar12->Dest];
          local_b0._M_impl._0_1_ = pcVar12->Strong;
          local_d8 = CONCAT71(local_d8._1_7_,pcVar12->Cross);
          std::vector<cmGraphEdge,std::allocator<cmGraphEdge>>::
          emplace_back<unsigned_long&,bool,bool,cmListFileBacktrace_const&>
                    ((vector<cmGraphEdge,std::allocator<cmGraphEdge>> *)
                     ((pGVar1->super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>).
                      super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                      super__Vector_impl_data._M_start + (long)local_c0),(unsigned_long *)&local_60,
                     (bool *)&local_b0,(bool *)&local_d8,&pcVar12->Backtrace);
          pcVar12 = pcVar12 + 1;
        } while (pcVar12 != pcVar5);
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != local_c8);
  }
LAB_004e7be8:
  return (bool)((byte)local_d0 & 1);
}

Assistant:

bool cmComputeTargetDepends::ComputeFinalDepends(
  cmComputeComponentGraph const& ccg)
{
  // Get the component graph information.
  std::vector<NodeList> const& components = ccg.GetComponents();
  Graph const& cgraph = ccg.GetComponentGraph();

  // Allocate the final graph.
  this->FinalGraph.resize(0);
  this->FinalGraph.resize(this->InitialGraph.size());

  // Choose intra-component edges to linearize dependencies.
  std::vector<size_t> const& cmap = ccg.GetComponentMap();
  this->ComponentHead.resize(components.size());
  this->ComponentTail.resize(components.size());
  size_t nc = components.size();
  for (size_t c = 0; c < nc; ++c) {
    size_t head = cmComputeComponentGraph::INVALID_COMPONENT;
    std::set<size_t> emitted;
    NodeList const& nl = components[c];
    for (size_t ni : cmReverseRange(nl)) {
      std::set<size_t> visited;
      if (!this->IntraComponent(cmap, c, ni, &head, emitted, visited)) {
        // Cycle in add_dependencies within component!
        this->ComplainAboutBadComponent(ccg, c, true);
        return false;
      }
    }
    this->ComponentHead[c] = head;
  }

  // Convert inter-component edges to connect component tails to heads.
  size_t n = cgraph.size();
  for (size_t depender_component = 0; depender_component < n;
       ++depender_component) {
    size_t depender_component_tail = this->ComponentTail[depender_component];
    EdgeList const& nl = cgraph[depender_component];
    for (cmGraphEdge const& ni : nl) {
      size_t dependee_component = ni;
      size_t dependee_component_head = this->ComponentHead[dependee_component];
      this->FinalGraph[depender_component_tail].emplace_back(
        dependee_component_head, ni.IsStrong(), ni.IsCross(),
        ni.GetBacktrace());
    }
  }
  return true;
}